

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varenaalloc.h
# Opt level: O0

char * __thiscall VArenaAlloc::allocObject(VArenaAlloc *this,uint32_t size,uint32_t alignment)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t in_stack_00000008;
  uint32_t in_stack_0000000c;
  uintptr_t totalSize;
  uintptr_t alignedOffset;
  uintptr_t mask;
  undefined8 local_20;
  
  local_20 = (*(ulong *)(in_RDI + 8) ^ 0xffffffffffffffff) + 1 & (ulong)(in_EDX - 1);
  AssertRelease(false);
  if ((ulong)(*(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8)) < in_ESI + local_20) {
    ensureSpace((VArenaAlloc *)totalSize,in_stack_0000000c,in_stack_00000008);
    local_20 = (*(ulong *)(in_RDI + 8) ^ 0xffffffffffffffff) + 1 & (ulong)(in_EDX - 1);
  }
  return (char *)(*(long *)(in_RDI + 8) + local_20);
}

Assistant:

char* allocObject(uint32_t size, uint32_t alignment) {
        uintptr_t mask = alignment - 1;
        uintptr_t alignedOffset = (~reinterpret_cast<uintptr_t>(fCursor) + 1) & mask;
        uintptr_t totalSize = size + alignedOffset;
        AssertRelease(totalSize >= size);

        if (totalSize > static_cast<uintptr_t>(fEnd - fCursor)) {
            this->ensureSpace(size, alignment);
            alignedOffset = (~reinterpret_cast<uintptr_t>(fCursor) + 1) & mask;
        }
        return fCursor + alignedOffset;
    }